

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O2

void __thiscall FC_BPNN::setLearningStep(FC_BPNN *this,double a)

{
  pointer pmVar1;
  pointer pmVar2;
  _Rb_tree_node_base *p_Var3;
  int i;
  ulong uVar4;
  
  pmVar1 = (this->net).
           super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pmVar2 = (this->net).
           super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar4 = 0; uVar4 < (ulong)(((long)pmVar2 - (long)pmVar1) / 0x30); uVar4 = uVar4 + 1) {
    for (p_Var3 = *(_Base_ptr *)((long)&pmVar1[uVar4]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var3 != &pmVar1[uVar4]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      *(double *)(p_Var3[1]._M_parent + 3) = a;
    }
  }
  return;
}

Assistant:

void FC_BPNN::setLearningStep(double a)
{
	for (int i = 0; i < net.size(); i++) {
		for (auto& element : net[i]) {
			element.second->learning_step = a;
		}
	}
}